

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall sfc::Image::save_scaled(Image *this,string *path,Mode mode)

{
  size_type sVar1;
  rgba_t rVar2;
  uint uVar3;
  runtime_error *this_00;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  rgba_t *color;
  pointer puVar7;
  _Alloc_hider _Var8;
  rgba_vec_t vc_1;
  rgba_vec_t vc;
  byte_vec_t scaled_data;
  allocator_type local_91;
  string local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  rgba_vec_t local_40;
  
  to_rgba(&local_40,&this->_data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,&local_40);
  for (puVar7 = local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 != local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    rVar2 = reduce_color(*puVar7,mode);
    *puVar7 = rVar2;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,&local_70);
  sVar1 = local_90._M_string_length;
  for (_Var8._M_p = local_90._M_dataplus._M_p; _Var8._M_p != (pointer)sVar1;
      _Var8._M_p = _Var8._M_p + 4) {
    rVar2 = normalize_color(*(rgba_t *)_Var8._M_p,mode);
    *(rgba_t *)_Var8._M_p = rVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,local_90._M_string_length - (long)local_90._M_dataplus._M_p,&local_91);
  if ((pointer)local_90._M_string_length != local_90._M_dataplus._M_p) {
    uVar3 = 1;
    uVar5 = 3;
    uVar6 = 0;
    do {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5 - 3] = local_90._M_dataplus._M_p[uVar6 * 4];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5 - 2] = local_90._M_dataplus._M_p[uVar6 * 4 + 1];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5 - 1] = local_90._M_dataplus._M_p[uVar6 * 4 + 2];
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = local_90._M_dataplus._M_p[uVar6 * 4 + 3];
      uVar6 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 + 4;
    } while (uVar6 < (ulong)((long)(local_90._M_string_length - (long)local_90._M_dataplus._M_p) >>
                            2));
  }
  if ((rgba_t *)local_90._M_dataplus._M_p != (rgba_t *)0x0) {
    operator_delete(local_90._M_dataplus._M_p,
                    local_90.field_2._M_allocated_capacity - (long)local_90._M_dataplus._M_p);
  }
  if (local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (rgba_t *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(path->_M_dataplus)._M_p,(allocator<char> *)&local_70);
  uVar3 = lodepng::encode(&local_90,&local_58,this->_width,this->_height,LCT_RGBA,8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (uVar3 == 0) {
    if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar4 = lodepng_error_text(uVar3);
  std::runtime_error::runtime_error(this_00,pcVar4);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save_scaled(const std::string& path, Mode mode) {
  auto scaled_data = to_bytes(normalize_colors(reduce_colors(rgba_data(), mode), mode));
  unsigned error = lodepng::encode(path.c_str(), scaled_data, _width, _height, LCT_RGBA, 8);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
}